

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O1

bool __thiscall
irr::video::COpenGL3DriverBase::setClipPlane
          (COpenGL3DriverBase *this,u32 index,plane3df *plane,bool enable)

{
  array<irr::video::COpenGL3DriverBase::SUserClipPlane> *this_00;
  pointer pSVar1;
  pointer *ppSVar2;
  iterator __position;
  undefined8 uVar3;
  SUserClipPlane local_48;
  
  __position._M_current =
       (this->UserClipPlane).m_data.
       super__Vector_base<irr::video::COpenGL3DriverBase::SUserClipPlane,_std::allocator<irr::video::COpenGL3DriverBase::SUserClipPlane>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &this->UserClipPlane;
  if ((uint)((int)((ulong)((long)__position._M_current -
                          (long)(this->UserClipPlane).m_data.
                                super__Vector_base<irr::video::COpenGL3DriverBase::SUserClipPlane,_std::allocator<irr::video::COpenGL3DriverBase::SUserClipPlane>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x33333333) <=
      index) {
    local_48.Plane.Normal.X = 0.0;
    local_48.Enabled = false;
    local_48._17_3_ = 0;
    local_48.Plane.Normal.Y = 1.0;
    local_48.Plane.Normal.Z = 0.0;
    local_48.Plane.D = -0.0;
    if (__position._M_current ==
        (this->UserClipPlane).m_data.
        super__Vector_base<irr::video::COpenGL3DriverBase::SUserClipPlane,_std::allocator<irr::video::COpenGL3DriverBase::SUserClipPlane>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<irr::video::COpenGL3DriverBase::SUserClipPlane,_std::allocator<irr::video::COpenGL3DriverBase::SUserClipPlane>_>
      ::_M_realloc_insert<irr::video::COpenGL3DriverBase::SUserClipPlane>
                (&this_00->m_data,__position,&local_48);
    }
    else {
      *(undefined4 *)&(__position._M_current)->Enabled = 0;
      ((__position._M_current)->Plane).Normal.X = 0.0;
      ((__position._M_current)->Plane).Normal.Y = 1.0;
      *(undefined8 *)&((__position._M_current)->Plane).Normal.Z = 0x8000000000000000;
      ppSVar2 = &(this->UserClipPlane).m_data.
                 super__Vector_base<irr::video::COpenGL3DriverBase::SUserClipPlane,_std::allocator<irr::video::COpenGL3DriverBase::SUserClipPlane>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppSVar2 = *ppSVar2 + 1;
    }
    (this->UserClipPlane).is_sorted = false;
  }
  uVar3 = *(undefined8 *)&(plane->Normal).Z;
  pSVar1 = (this_00->m_data).
           super__Vector_base<irr::video::COpenGL3DriverBase::SUserClipPlane,_std::allocator<irr::video::COpenGL3DriverBase::SUserClipPlane>_>
           ._M_impl.super__Vector_impl_data._M_start + index;
  *(undefined8 *)&(pSVar1->Plane).Normal = *(undefined8 *)&plane->Normal;
  *(undefined8 *)((long)&(pSVar1->Plane).Normal + 8) = uVar3;
  (this_00->m_data).
  super__Vector_base<irr::video::COpenGL3DriverBase::SUserClipPlane,_std::allocator<irr::video::COpenGL3DriverBase::SUserClipPlane>_>
  ._M_impl.super__Vector_impl_data._M_start[index].Enabled = enable;
  return true;
}

Assistant:

bool COpenGL3DriverBase::setClipPlane(u32 index, const core::plane3df &plane, bool enable)
{
	if (index >= UserClipPlane.size())
		UserClipPlane.push_back(SUserClipPlane());

	UserClipPlane[index].Plane = plane;
	UserClipPlane[index].Enabled = enable;
	return true;
}